

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetPHSRHandle(ndicapi *pol,int i)

{
  int iVar1;
  unsigned_long uVar2;
  
  uVar2 = ndiHexToUnsignedLong(pol->PhsrReply,2);
  iVar1 = 0;
  if ((-1 < i) && (i <= (int)uVar2)) {
    uVar2 = ndiHexToUnsignedLong(pol->PhsrReply + (ulong)(uint)(i * 5) + 2,2);
    iVar1 = (int)uVar2;
  }
  return iVar1;
}

Assistant:

ndicapiExport int ndiGetPHSRHandle(ndicapi* pol, int i)
{
  char* dp;
  int n;

  dp = pol->PhsrReply;
  n = (int)ndiHexToUnsignedLong(dp, 2);
  dp += 2;

  if (i < 0 || i > n)
  {
    return 0;
  }
  dp += 5 * i;

  return (int)ndiHexToUnsignedLong(dp, 2);
}